

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSvd2x2.h
# Opt level: O2

void Eigen::internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
               (Matrix<float,_3,_3,_0,_3,_3> *matrix,long p,long q,JacobiRotation<float> *j_left,
               JacobiRotation<float> *j_right)

{
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar1;
  float fVar5;
  JacobiRotation<float> JVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar6;
  Matrix<float,_2,_2,_0,_2,_2> m;
  float local_54;
  float local_50;
  float local_4c;
  JacobiRotation<float> rot1;
  
  rot1 = (JacobiRotation<float>)&m;
  m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [p * 4];
  local_4c = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 3 + p];
  pCVar1 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)&rot1,&local_4c);
  local_50 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[p * 3 + q];
  pCVar1 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar1,&local_50);
  local_54 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 4];
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar1,&local_54);
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)&rot1);
  if (1.1754944e-38 <=
      ABS(m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] -
          m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]))
  {
    fVar6 = (m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
            + m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
              [0]) / (m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
                      .array[1] -
                     m.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
                     array[2]);
    auVar3._4_12_ = DAT_00176170._4_12_;
    auVar3._0_4_ = fVar6;
    fVar6 = SQRT(fVar6 * fVar6 + 1.0);
    auVar4._4_4_ = fVar6;
    auVar4._0_4_ = fVar6;
    auVar4._8_4_ = fVar6;
    auVar4._12_4_ = fVar6;
    auVar4 = divps(auVar3,auVar4);
    rot1 = auVar4._0_8_;
  }
  else {
    rot1.m_c = 1.0;
    rot1.m_s = 0.0;
  }
  MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::applyOnTheLeft<float>
            ((MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)&m,0,1,&rot1);
  JacobiRotation<float>::makeJacobi<Eigen::Matrix<float,2,2,0,2,2>>
            (j_right,(MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)&m,0,1);
  fVar6 = (*j_right).m_c;
  fVar5 = (*j_right).m_s;
  JVar2.m_s = -fVar5 * rot1.m_c + rot1.m_s * fVar6;
  JVar2.m_c = fVar6 * rot1.m_c + rot1.m_s * fVar5;
  *j_left = JVar2;
  return;
}

Assistant:

void real_2x2_jacobi_svd(const MatrixType& matrix, Index p, Index q,
                         JacobiRotation<RealScalar> *j_left,
                         JacobiRotation<RealScalar> *j_right)
{
  using std::sqrt;
  using std::abs;
  Matrix<RealScalar,2,2> m;
  m << numext::real(matrix.coeff(p,p)), numext::real(matrix.coeff(p,q)),
       numext::real(matrix.coeff(q,p)), numext::real(matrix.coeff(q,q));
  JacobiRotation<RealScalar> rot1;
  RealScalar t = m.coeff(0,0) + m.coeff(1,1);
  RealScalar d = m.coeff(1,0) - m.coeff(0,1);

  if(abs(d) < (std::numeric_limits<RealScalar>::min)())
  {
    rot1.s() = RealScalar(0);
    rot1.c() = RealScalar(1);
  }
  else
  {
    // If d!=0, then t/d cannot overflow because the magnitude of the
    // entries forming d are not too small compared to the ones forming t.
    RealScalar u = t / d;
    RealScalar tmp = sqrt(RealScalar(1) + numext::abs2(u));
    rot1.s() = RealScalar(1) / tmp;
    rot1.c() = u / tmp;
  }
  m.applyOnTheLeft(0,1,rot1);
  j_right->makeJacobi(m,0,1);
  *j_left = rot1 * j_right->transpose();
}